

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O3

bool __thiscall Refal2::CVariablesBuilder::checkName(CVariablesBuilder *this,TVariableName name)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  int iVar5;
  undefined7 in_register_00000031;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  iVar5 = (int)CONCAT71(in_register_00000031,name);
  iVar1 = isalnum(iVar5);
  if (iVar5 != 0x5f && iVar1 == 0) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x13b533);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_80 = *plVar3;
      lStack_78 = plVar2[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar3;
      local_90 = (long *)*plVar2;
    }
    local_88 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_70.field_2._M_allocated_capacity = *psVar4;
      local_70.field_2._8_8_ = plVar2[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar4;
      local_70._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_70._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    CErrorsHelper::RaiseError(&this->super_CErrorsHelper,ES_Error,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  return iVar5 == 0x5f || iVar1 != 0;
}

Assistant:

bool CVariablesBuilder::checkName( const TVariableName name )
{
	if( ::isalnum( name ) != 0 || name == '_' ) {
		return true;
	}
	error( "invalid variable name `"
		+ std::string( 1, static_cast<char>( name ) )
		+ "`, only letter, digit or `_` allowed as variable name" );
	return false;
}